

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O1

TBuiltInVariable __thiscall
glslang::HlslScanContext::mapSemantic(HlslScanContext *this,char *upperCase)

{
  char cVar1;
  __node_ptr p_Var2;
  key_type *__key;
  TBuiltInVariable TVar3;
  char *pcVar4;
  char *local_10;
  
  cVar1 = *upperCase;
  if (cVar1 == '\0') {
    __key = (key_type *)0x1505;
  }
  else {
    pcVar4 = upperCase + 1;
    __key = (key_type *)0x1505;
    do {
      __key = (key_type *)((long)cVar1 + (long)__key * 0x21);
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  TVar3 = EbvNone;
  local_10 = upperCase;
  p_Var2 = std::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((ulong)__key % DAT_009b8d08),(size_type)&local_10,__key,
                          (__hash_code)__key);
  if (p_Var2 != (__node_ptr)0x0) {
    TVar3 = *(TBuiltInVariable *)
             ((long)&(p_Var2->
                     super__Hash_node_value<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>
                     ._M_storage._M_storage + 8);
  }
  return TVar3;
}

Assistant:

glslang::TBuiltInVariable HlslScanContext::mapSemantic(const char* upperCase)
{
    auto it = SemanticMap.find(upperCase);
    if (it != SemanticMap.end())
        return it->second;
    else
        return glslang::EbvNone;
}